

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int iVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar120;
  float fVar121;
  undefined1 auVar116 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_e68;
  ulong *local_e60;
  RTCFilterFunctionNArguments local_cf0;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  undefined4 uStack_c04;
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_e60 = local_7f8;
  local_800 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar111._4_4_ = uVar2;
  auVar111._0_4_ = uVar2;
  auVar111._8_4_ = uVar2;
  auVar111._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar116._4_4_ = uVar2;
  auVar116._0_4_ = uVar2;
  auVar116._8_4_ = uVar2;
  auVar116._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar36 = fVar3 * 0.99999964;
  fVar37 = fVar4 * 0.99999964;
  fVar38 = fVar5 * 0.99999964;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar63 = (tray->tnear).field_0.i[k];
  auVar91._4_4_ = iVar63;
  auVar91._0_4_ = iVar63;
  auVar91._8_4_ = iVar63;
  auVar91._12_4_ = iVar63;
  iVar63 = (tray->tfar).field_0.i[k];
  auVar97._4_4_ = iVar63;
  auVar97._0_4_ = iVar63;
  auVar97._8_4_ = iVar63;
  auVar97._12_4_ = iVar63;
  local_c00._16_16_ = mm_lookupmask_ps._240_16_;
  local_c00._0_16_ = mm_lookupmask_ps._0_16_;
  iVar63 = 1 << ((uint)k & 0x1f);
  auVar74._4_4_ = iVar63;
  auVar74._0_4_ = iVar63;
  auVar74._8_4_ = iVar63;
  auVar74._12_4_ = iVar63;
  auVar74._16_4_ = iVar63;
  auVar74._20_4_ = iVar63;
  auVar74._24_4_ = iVar63;
  auVar74._28_4_ = iVar63;
  auVar75 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar74 = vpand_avx2(auVar74,auVar75);
  local_c40 = vpcmpeqd_avx2(auVar74,auVar75);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  auVar75._8_4_ = 0xbf800000;
  auVar75._0_8_ = 0xbf800000bf800000;
  auVar75._12_4_ = 0xbf800000;
  auVar75._16_4_ = 0xbf800000;
  auVar75._20_4_ = 0xbf800000;
  auVar75._24_4_ = 0xbf800000;
  auVar75._28_4_ = 0xbf800000;
  _local_c20 = vblendvps_avx(auVar81,auVar75,local_c00);
  do {
    if (local_e60 == &local_800) {
LAB_0160c015:
      return local_e60 != &local_800;
    }
    local_e68 = local_e60 + -1;
    uVar67 = local_e60[-1];
    while ((uVar67 & 8) == 0) {
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar70),auVar111);
      auVar73._0_4_ = fVar36 * auVar39._0_4_;
      auVar73._4_4_ = fVar36 * auVar39._4_4_;
      auVar73._8_4_ = fVar36 * auVar39._8_4_;
      auVar73._12_4_ = fVar36 * auVar39._12_4_;
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar72),auVar113);
      auVar78._0_4_ = fVar37 * auVar39._0_4_;
      auVar78._4_4_ = fVar37 * auVar39._4_4_;
      auVar78._8_4_ = fVar37 * auVar39._8_4_;
      auVar78._12_4_ = fVar37 * auVar39._12_4_;
      auVar39 = vmaxps_avx(auVar73,auVar78);
      auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar71),auVar116);
      auVar79._0_4_ = fVar38 * auVar73._0_4_;
      auVar79._4_4_ = fVar38 * auVar73._4_4_;
      auVar79._8_4_ = fVar38 * auVar73._8_4_;
      auVar79._12_4_ = fVar38 * auVar73._12_4_;
      auVar73 = vmaxps_avx(auVar79,auVar91);
      auVar39 = vmaxps_avx(auVar39,auVar73);
      auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + (uVar70 ^ 0x10)),auVar111);
      auVar80._0_4_ = fVar3 * auVar73._0_4_;
      auVar80._4_4_ = fVar3 * auVar73._4_4_;
      auVar80._8_4_ = fVar3 * auVar73._8_4_;
      auVar80._12_4_ = fVar3 * auVar73._12_4_;
      auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + (uVar72 ^ 0x10)),auVar113);
      auVar86._0_4_ = fVar4 * auVar73._0_4_;
      auVar86._4_4_ = fVar4 * auVar73._4_4_;
      auVar86._8_4_ = fVar4 * auVar73._8_4_;
      auVar86._12_4_ = fVar4 * auVar73._12_4_;
      auVar73 = vminps_avx(auVar80,auVar86);
      auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + (uVar71 ^ 0x10)),auVar116);
      auVar87._0_4_ = fVar5 * auVar78._0_4_;
      auVar87._4_4_ = fVar5 * auVar78._4_4_;
      auVar87._8_4_ = fVar5 * auVar78._8_4_;
      auVar87._12_4_ = fVar5 * auVar78._12_4_;
      auVar78 = vminps_avx(auVar87,auVar97);
      auVar73 = vminps_avx(auVar73,auVar78);
      auVar39 = vcmpps_avx(auVar39,auVar73,2);
      uVar64 = vmovmskps_avx(auVar39);
      if (uVar64 == 0) goto LAB_0160bfea;
      uVar64 = uVar64 & 0xff;
      uVar65 = uVar67 & 0xfffffffffffffff0;
      lVar68 = 0;
      for (uVar67 = (ulong)uVar64; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        lVar68 = lVar68 + 1;
      }
      uVar67 = *(ulong *)(uVar65 + lVar68 * 8);
      uVar64 = uVar64 - 1 & uVar64;
      uVar69 = (ulong)uVar64;
      if (uVar64 != 0) {
        do {
          *local_e68 = uVar67;
          local_e68 = local_e68 + 1;
          lVar68 = 0;
          for (uVar67 = uVar69; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
            lVar68 = lVar68 + 1;
          }
          uVar69 = uVar69 - 1 & uVar69;
          uVar67 = *(ulong *)(uVar65 + lVar68 * 8);
        } while (uVar69 != 0);
      }
    }
    uVar65 = uVar67 & 0xfffffffffffffff0;
    for (lVar68 = 0; lVar68 != (ulong)((uint)uVar67 & 0xf) - 8; lVar68 = lVar68 + 1) {
      lVar66 = lVar68 * 0x60;
      pSVar6 = context->scene;
      ppfVar7 = (pSVar6->vertices).items;
      pfVar8 = ppfVar7[*(uint *)(uVar65 + 0x40 + lVar66)];
      auVar88._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 0x20 + lVar66));
      auVar88._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + lVar66));
      pfVar9 = ppfVar7[*(uint *)(uVar65 + 0x48 + lVar66)];
      auVar92._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0x28 + lVar66));
      auVar92._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 8 + lVar66));
      pfVar10 = ppfVar7[*(uint *)(uVar65 + 0x44 + lVar66)];
      auVar103._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 0x24 + lVar66));
      auVar103._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 4 + lVar66));
      pfVar11 = ppfVar7[*(uint *)(uVar65 + 0x4c + lVar66)];
      auVar117._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0x2c + lVar66));
      auVar117._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0xc + lVar66));
      lVar1 = uVar65 + 0x40 + lVar66;
      local_b00 = *(undefined8 *)(lVar1 + 0x10);
      uStack_af8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_af0 = local_b00;
      uStack_ae8 = uStack_af8;
      lVar1 = uVar65 + 0x50 + lVar66;
      local_b20 = *(undefined8 *)(lVar1 + 0x10);
      uStack_b18 = *(undefined8 *)(lVar1 + 0x18);
      auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 0x10 + lVar66)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0x18 + lVar66)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 0x10 + lVar66)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0x18 + lVar66)));
      auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 0x14 + lVar66)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0x1c + lVar66)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 0x14 + lVar66)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0x1c + lVar66)));
      auVar80 = vunpcklps_avx(auVar39,auVar73);
      auVar86 = vunpcklps_avx(auVar78,auVar79);
      auVar39 = vunpckhps_avx(auVar78,auVar79);
      auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 0x30 + lVar66)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0x38 + lVar66)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 0x30 + lVar66)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0x38 + lVar66)));
      auVar87 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 0x34 + lVar66)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0x3c + lVar66)));
      auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar65 + 0x34 + lVar66)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar65 + 0x3c + lVar66)));
      auVar78 = vunpcklps_avx(auVar73,auVar78);
      auVar43 = vunpcklps_avx(auVar79,auVar87);
      auVar73 = vunpckhps_avx(auVar79,auVar87);
      uStack_b10 = local_b20;
      uStack_b08 = uStack_b18;
      auVar74 = vunpcklps_avx(auVar103,auVar117);
      auVar75 = vunpcklps_avx(auVar88,auVar92);
      auVar114 = vunpcklps_avx(auVar75,auVar74);
      auVar74 = vunpckhps_avx(auVar75,auVar74);
      auVar75 = vunpckhps_avx(auVar103,auVar117);
      auVar81 = vunpckhps_avx(auVar88,auVar92);
      auVar75 = vunpcklps_avx(auVar81,auVar75);
      auVar93._16_16_ = auVar86;
      auVar93._0_16_ = auVar86;
      auVar104._16_16_ = auVar39;
      auVar104._0_16_ = auVar39;
      auVar82._16_16_ = auVar80;
      auVar82._0_16_ = auVar80;
      auVar132._16_16_ = auVar43;
      auVar132._0_16_ = auVar43;
      auVar98._16_16_ = auVar73;
      auVar98._0_16_ = auVar73;
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar118._4_4_ = uVar2;
      auVar118._0_4_ = uVar2;
      auVar118._8_4_ = uVar2;
      auVar118._12_4_ = uVar2;
      auVar118._16_4_ = uVar2;
      auVar118._20_4_ = uVar2;
      auVar118._24_4_ = uVar2;
      auVar118._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar128._4_4_ = uVar2;
      auVar128._0_4_ = uVar2;
      auVar128._8_4_ = uVar2;
      auVar128._12_4_ = uVar2;
      auVar128._16_4_ = uVar2;
      auVar128._20_4_ = uVar2;
      auVar128._24_4_ = uVar2;
      auVar128._28_4_ = uVar2;
      auVar76._16_16_ = auVar78;
      auVar76._0_16_ = auVar78;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar130._4_4_ = uVar2;
      auVar130._0_4_ = uVar2;
      auVar130._8_4_ = uVar2;
      auVar130._12_4_ = uVar2;
      auVar130._16_4_ = uVar2;
      auVar130._20_4_ = uVar2;
      auVar130._24_4_ = uVar2;
      auVar130._28_4_ = uVar2;
      local_ca0 = vsubps_avx(auVar114,auVar118);
      auVar114 = vsubps_avx(auVar74,auVar128);
      local_cc0 = vsubps_avx(auVar75,auVar130);
      auVar74 = vsubps_avx(auVar93,auVar118);
      auVar75 = vsubps_avx(auVar104,auVar128);
      auVar81 = vsubps_avx(auVar82,auVar130);
      auVar82 = vsubps_avx(auVar132,auVar118);
      auVar88 = vsubps_avx(auVar98,auVar128);
      auVar40 = vsubps_avx(auVar76,auVar130);
      auVar76 = vsubps_avx(auVar82,local_ca0);
      auVar92 = vsubps_avx(auVar88,auVar114);
      auVar93 = vsubps_avx(auVar40,local_cc0);
      auVar77._0_4_ = local_ca0._0_4_ + auVar82._0_4_;
      auVar77._4_4_ = local_ca0._4_4_ + auVar82._4_4_;
      auVar77._8_4_ = local_ca0._8_4_ + auVar82._8_4_;
      auVar77._12_4_ = local_ca0._12_4_ + auVar82._12_4_;
      auVar77._16_4_ = local_ca0._16_4_ + auVar82._16_4_;
      auVar77._20_4_ = local_ca0._20_4_ + auVar82._20_4_;
      auVar77._24_4_ = local_ca0._24_4_ + auVar82._24_4_;
      auVar77._28_4_ = local_ca0._28_4_ + auVar82._28_4_;
      auVar89._0_4_ = auVar114._0_4_ + auVar88._0_4_;
      auVar89._4_4_ = auVar114._4_4_ + auVar88._4_4_;
      auVar89._8_4_ = auVar114._8_4_ + auVar88._8_4_;
      auVar89._12_4_ = auVar114._12_4_ + auVar88._12_4_;
      auVar89._16_4_ = auVar114._16_4_ + auVar88._16_4_;
      auVar89._20_4_ = auVar114._20_4_ + auVar88._20_4_;
      auVar89._24_4_ = auVar114._24_4_ + auVar88._24_4_;
      auVar89._28_4_ = auVar114._28_4_ + auVar88._28_4_;
      fVar14 = local_cc0._0_4_;
      auVar99._0_4_ = auVar40._0_4_ + fVar14;
      fVar15 = local_cc0._4_4_;
      auVar99._4_4_ = auVar40._4_4_ + fVar15;
      fVar16 = local_cc0._8_4_;
      auVar99._8_4_ = auVar40._8_4_ + fVar16;
      fVar17 = local_cc0._12_4_;
      auVar99._12_4_ = auVar40._12_4_ + fVar17;
      fVar18 = local_cc0._16_4_;
      auVar99._16_4_ = auVar40._16_4_ + fVar18;
      fVar19 = local_cc0._20_4_;
      auVar99._20_4_ = auVar40._20_4_ + fVar19;
      fVar20 = local_cc0._24_4_;
      auVar99._24_4_ = auVar40._24_4_ + fVar20;
      fVar102 = local_cc0._28_4_;
      auVar99._28_4_ = auVar40._28_4_ + fVar102;
      auVar41._4_4_ = auVar93._4_4_ * auVar89._4_4_;
      auVar41._0_4_ = auVar93._0_4_ * auVar89._0_4_;
      auVar41._8_4_ = auVar93._8_4_ * auVar89._8_4_;
      auVar41._12_4_ = auVar93._12_4_ * auVar89._12_4_;
      auVar41._16_4_ = auVar93._16_4_ * auVar89._16_4_;
      auVar41._20_4_ = auVar93._20_4_ * auVar89._20_4_;
      auVar41._24_4_ = auVar93._24_4_ * auVar89._24_4_;
      auVar41._28_4_ = uVar2;
      auVar73 = vfmsub231ps_fma(auVar41,auVar92,auVar99);
      auVar42._4_4_ = auVar76._4_4_ * auVar99._4_4_;
      auVar42._0_4_ = auVar76._0_4_ * auVar99._0_4_;
      auVar42._8_4_ = auVar76._8_4_ * auVar99._8_4_;
      auVar42._12_4_ = auVar76._12_4_ * auVar99._12_4_;
      auVar42._16_4_ = auVar76._16_4_ * auVar99._16_4_;
      auVar42._20_4_ = auVar76._20_4_ * auVar99._20_4_;
      auVar42._24_4_ = auVar76._24_4_ * auVar99._24_4_;
      auVar42._28_4_ = auVar99._28_4_;
      auVar39 = vfmsub231ps_fma(auVar42,auVar93,auVar77);
      auVar46._4_4_ = auVar92._4_4_ * auVar77._4_4_;
      auVar46._0_4_ = auVar92._0_4_ * auVar77._0_4_;
      auVar46._8_4_ = auVar92._8_4_ * auVar77._8_4_;
      auVar46._12_4_ = auVar92._12_4_ * auVar77._12_4_;
      auVar46._16_4_ = auVar92._16_4_ * auVar77._16_4_;
      auVar46._20_4_ = auVar92._20_4_ * auVar77._20_4_;
      auVar46._24_4_ = auVar92._24_4_ * auVar77._24_4_;
      auVar46._28_4_ = auVar77._28_4_;
      auVar78 = vfmsub231ps_fma(auVar46,auVar76,auVar89);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar129._4_4_ = uVar2;
      auVar129._0_4_ = uVar2;
      auVar129._8_4_ = uVar2;
      auVar129._12_4_ = uVar2;
      auVar129._16_4_ = uVar2;
      auVar129._20_4_ = uVar2;
      auVar129._24_4_ = uVar2;
      auVar129._28_4_ = uVar2;
      local_b60 = *(float *)(ray + k * 4 + 0xc0);
      auVar47._4_4_ = local_b60 * auVar78._4_4_;
      auVar47._0_4_ = local_b60 * auVar78._0_4_;
      auVar47._8_4_ = local_b60 * auVar78._8_4_;
      auVar47._12_4_ = local_b60 * auVar78._12_4_;
      auVar47._16_4_ = local_b60 * 0.0;
      auVar47._20_4_ = local_b60 * 0.0;
      auVar47._24_4_ = local_b60 * 0.0;
      auVar47._28_4_ = auVar89._28_4_;
      auVar39 = vfmadd231ps_fma(auVar47,auVar129,ZEXT1632(auVar39));
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_b40._4_4_ = uVar2;
      local_b40._0_4_ = uVar2;
      local_b40._8_4_ = uVar2;
      local_b40._12_4_ = uVar2;
      local_b40._16_4_ = uVar2;
      local_b40._20_4_ = uVar2;
      local_b40._24_4_ = uVar2;
      local_b40._28_4_ = uVar2;
      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),local_b40,ZEXT1632(auVar73));
      local_b80 = vsubps_avx(auVar114,auVar75);
      local_ba0 = vsubps_avx(local_cc0,auVar81);
      auVar131._0_4_ = auVar114._0_4_ + auVar75._0_4_;
      auVar131._4_4_ = auVar114._4_4_ + auVar75._4_4_;
      auVar131._8_4_ = auVar114._8_4_ + auVar75._8_4_;
      auVar131._12_4_ = auVar114._12_4_ + auVar75._12_4_;
      auVar131._16_4_ = auVar114._16_4_ + auVar75._16_4_;
      auVar131._20_4_ = auVar114._20_4_ + auVar75._20_4_;
      auVar131._24_4_ = auVar114._24_4_ + auVar75._24_4_;
      auVar131._28_4_ = auVar114._28_4_ + auVar75._28_4_;
      auVar100._0_4_ = fVar14 + auVar81._0_4_;
      auVar100._4_4_ = fVar15 + auVar81._4_4_;
      auVar100._8_4_ = fVar16 + auVar81._8_4_;
      auVar100._12_4_ = fVar17 + auVar81._12_4_;
      auVar100._16_4_ = fVar18 + auVar81._16_4_;
      auVar100._20_4_ = fVar19 + auVar81._20_4_;
      auVar100._24_4_ = fVar20 + auVar81._24_4_;
      fVar115 = auVar81._28_4_;
      auVar100._28_4_ = fVar102 + fVar115;
      fVar106 = local_ba0._0_4_;
      fVar108 = local_ba0._4_4_;
      auVar48._4_4_ = auVar131._4_4_ * fVar108;
      auVar48._0_4_ = auVar131._0_4_ * fVar106;
      fVar21 = local_ba0._8_4_;
      auVar48._8_4_ = auVar131._8_4_ * fVar21;
      fVar24 = local_ba0._12_4_;
      auVar48._12_4_ = auVar131._12_4_ * fVar24;
      fVar27 = local_ba0._16_4_;
      auVar48._16_4_ = auVar131._16_4_ * fVar27;
      fVar30 = local_ba0._20_4_;
      auVar48._20_4_ = auVar131._20_4_ * fVar30;
      fVar33 = local_ba0._24_4_;
      auVar48._24_4_ = auVar131._24_4_ * fVar33;
      auVar48._28_4_ = fVar102;
      auVar78 = vfmsub231ps_fma(auVar48,local_b80,auVar100);
      auVar41 = vsubps_avx(local_ca0,auVar74);
      fVar102 = auVar41._0_4_;
      fVar109 = auVar41._4_4_;
      auVar49._4_4_ = auVar100._4_4_ * fVar109;
      auVar49._0_4_ = auVar100._0_4_ * fVar102;
      fVar22 = auVar41._8_4_;
      auVar49._8_4_ = auVar100._8_4_ * fVar22;
      fVar25 = auVar41._12_4_;
      auVar49._12_4_ = auVar100._12_4_ * fVar25;
      fVar28 = auVar41._16_4_;
      auVar49._16_4_ = auVar100._16_4_ * fVar28;
      fVar31 = auVar41._20_4_;
      auVar49._20_4_ = auVar100._20_4_ * fVar31;
      fVar34 = auVar41._24_4_;
      auVar49._24_4_ = auVar100._24_4_ * fVar34;
      auVar49._28_4_ = auVar100._28_4_;
      auVar126._0_4_ = local_ca0._0_4_ + auVar74._0_4_;
      auVar126._4_4_ = local_ca0._4_4_ + auVar74._4_4_;
      auVar126._8_4_ = local_ca0._8_4_ + auVar74._8_4_;
      auVar126._12_4_ = local_ca0._12_4_ + auVar74._12_4_;
      auVar126._16_4_ = local_ca0._16_4_ + auVar74._16_4_;
      auVar126._20_4_ = local_ca0._20_4_ + auVar74._20_4_;
      auVar126._24_4_ = local_ca0._24_4_ + auVar74._24_4_;
      auVar126._28_4_ = local_ca0._28_4_ + auVar74._28_4_;
      auVar73 = vfmsub231ps_fma(auVar49,local_ba0,auVar126);
      fVar107 = local_b80._0_4_;
      fVar110 = local_b80._4_4_;
      auVar50._4_4_ = auVar126._4_4_ * fVar110;
      auVar50._0_4_ = auVar126._0_4_ * fVar107;
      fVar23 = local_b80._8_4_;
      auVar50._8_4_ = auVar126._8_4_ * fVar23;
      fVar26 = local_b80._12_4_;
      auVar50._12_4_ = auVar126._12_4_ * fVar26;
      fVar29 = local_b80._16_4_;
      auVar50._16_4_ = auVar126._16_4_ * fVar29;
      fVar32 = local_b80._20_4_;
      auVar50._20_4_ = auVar126._20_4_ * fVar32;
      fVar35 = local_b80._24_4_;
      auVar50._24_4_ = auVar126._24_4_ * fVar35;
      auVar50._28_4_ = local_ba0._28_4_;
      auVar79 = vfmsub231ps_fma(auVar50,auVar41,auVar131);
      auVar119._0_4_ = auVar79._0_4_ * local_b60;
      auVar119._4_4_ = auVar79._4_4_ * local_b60;
      auVar119._8_4_ = auVar79._8_4_ * local_b60;
      auVar119._12_4_ = auVar79._12_4_ * local_b60;
      auVar119._16_4_ = local_b60 * 0.0;
      auVar119._20_4_ = local_b60 * 0.0;
      auVar119._24_4_ = local_b60 * 0.0;
      auVar119._28_4_ = 0;
      auVar73 = vfmadd231ps_fma(auVar119,auVar129,ZEXT1632(auVar73));
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_b40,ZEXT1632(auVar78));
      auVar42 = vsubps_avx(auVar74,auVar82);
      auVar94._0_4_ = auVar74._0_4_ + auVar82._0_4_;
      auVar94._4_4_ = auVar74._4_4_ + auVar82._4_4_;
      auVar94._8_4_ = auVar74._8_4_ + auVar82._8_4_;
      auVar94._12_4_ = auVar74._12_4_ + auVar82._12_4_;
      auVar94._16_4_ = auVar74._16_4_ + auVar82._16_4_;
      auVar94._20_4_ = auVar74._20_4_ + auVar82._20_4_;
      auVar94._24_4_ = auVar74._24_4_ + auVar82._24_4_;
      auVar94._28_4_ = auVar74._28_4_ + auVar82._28_4_;
      auVar82 = vsubps_avx(auVar75,auVar88);
      auVar105._0_4_ = auVar75._0_4_ + auVar88._0_4_;
      auVar105._4_4_ = auVar75._4_4_ + auVar88._4_4_;
      auVar105._8_4_ = auVar75._8_4_ + auVar88._8_4_;
      auVar105._12_4_ = auVar75._12_4_ + auVar88._12_4_;
      auVar105._16_4_ = auVar75._16_4_ + auVar88._16_4_;
      auVar105._20_4_ = auVar75._20_4_ + auVar88._20_4_;
      auVar105._24_4_ = auVar75._24_4_ + auVar88._24_4_;
      auVar105._28_4_ = auVar75._28_4_ + auVar88._28_4_;
      auVar88 = vsubps_avx(auVar81,auVar40);
      auVar83._0_4_ = auVar81._0_4_ + auVar40._0_4_;
      auVar83._4_4_ = auVar81._4_4_ + auVar40._4_4_;
      auVar83._8_4_ = auVar81._8_4_ + auVar40._8_4_;
      auVar83._12_4_ = auVar81._12_4_ + auVar40._12_4_;
      auVar83._16_4_ = auVar81._16_4_ + auVar40._16_4_;
      auVar83._20_4_ = auVar81._20_4_ + auVar40._20_4_;
      auVar83._24_4_ = auVar81._24_4_ + auVar40._24_4_;
      auVar83._28_4_ = fVar115 + auVar40._28_4_;
      auVar40._4_4_ = auVar88._4_4_ * auVar105._4_4_;
      auVar40._0_4_ = auVar88._0_4_ * auVar105._0_4_;
      auVar40._8_4_ = auVar88._8_4_ * auVar105._8_4_;
      auVar40._12_4_ = auVar88._12_4_ * auVar105._12_4_;
      auVar40._16_4_ = auVar88._16_4_ * auVar105._16_4_;
      auVar40._20_4_ = auVar88._20_4_ * auVar105._20_4_;
      auVar40._24_4_ = auVar88._24_4_ * auVar105._24_4_;
      auVar40._28_4_ = fVar115;
      auVar79 = vfmsub231ps_fma(auVar40,auVar82,auVar83);
      auVar51._4_4_ = auVar83._4_4_ * auVar42._4_4_;
      auVar51._0_4_ = auVar83._0_4_ * auVar42._0_4_;
      auVar51._8_4_ = auVar83._8_4_ * auVar42._8_4_;
      auVar51._12_4_ = auVar83._12_4_ * auVar42._12_4_;
      auVar51._16_4_ = auVar83._16_4_ * auVar42._16_4_;
      auVar51._20_4_ = auVar83._20_4_ * auVar42._20_4_;
      auVar51._24_4_ = auVar83._24_4_ * auVar42._24_4_;
      auVar51._28_4_ = auVar83._28_4_;
      auVar78 = vfmsub231ps_fma(auVar51,auVar88,auVar94);
      auVar52._4_4_ = auVar82._4_4_ * auVar94._4_4_;
      auVar52._0_4_ = auVar82._0_4_ * auVar94._0_4_;
      auVar52._8_4_ = auVar82._8_4_ * auVar94._8_4_;
      auVar52._12_4_ = auVar82._12_4_ * auVar94._12_4_;
      auVar52._16_4_ = auVar82._16_4_ * auVar94._16_4_;
      auVar52._20_4_ = auVar82._20_4_ * auVar94._20_4_;
      auVar52._24_4_ = auVar82._24_4_ * auVar94._24_4_;
      auVar52._28_4_ = auVar94._28_4_;
      auVar80 = vfmsub231ps_fma(auVar52,auVar42,auVar105);
      auVar95._0_4_ = local_b60 * auVar80._0_4_;
      auVar95._4_4_ = local_b60 * auVar80._4_4_;
      auVar95._8_4_ = local_b60 * auVar80._8_4_;
      auVar95._12_4_ = local_b60 * auVar80._12_4_;
      auVar95._16_4_ = local_b60 * 0.0;
      auVar95._20_4_ = local_b60 * 0.0;
      auVar95._24_4_ = local_b60 * 0.0;
      auVar95._28_4_ = 0;
      auVar78 = vfmadd231ps_fma(auVar95,auVar129,ZEXT1632(auVar78));
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_b40,ZEXT1632(auVar79));
      local_ac0 = ZEXT1632(auVar73);
      local_ae0 = auVar39._0_4_;
      fStack_adc = auVar39._4_4_;
      fStack_ad8 = auVar39._8_4_;
      fStack_ad4 = auVar39._12_4_;
      local_aa0 = ZEXT1632(CONCAT412(auVar78._12_4_ + auVar73._12_4_ + fStack_ad4,
                                     CONCAT48(auVar78._8_4_ + auVar73._8_4_ + fStack_ad8,
                                              CONCAT44(auVar78._4_4_ + auVar73._4_4_ + fStack_adc,
                                                       auVar78._0_4_ + auVar73._0_4_ + local_ae0))))
      ;
      auVar84._8_4_ = 0x7fffffff;
      auVar84._0_8_ = 0x7fffffff7fffffff;
      auVar84._12_4_ = 0x7fffffff;
      auVar84._16_4_ = 0x7fffffff;
      auVar84._20_4_ = 0x7fffffff;
      auVar84._24_4_ = 0x7fffffff;
      auVar84._28_4_ = 0x7fffffff;
      auVar74 = vminps_avx(ZEXT1632(auVar39),local_ac0);
      auVar74 = vminps_avx(auVar74,ZEXT1632(auVar78));
      local_be0 = vandps_avx(local_aa0,auVar84);
      fVar115 = local_be0._0_4_ * 1.1920929e-07;
      fVar120 = local_be0._4_4_ * 1.1920929e-07;
      auVar53._4_4_ = fVar120;
      auVar53._0_4_ = fVar115;
      fVar121 = local_be0._8_4_ * 1.1920929e-07;
      auVar53._8_4_ = fVar121;
      fVar122 = local_be0._12_4_ * 1.1920929e-07;
      auVar53._12_4_ = fVar122;
      fVar123 = local_be0._16_4_ * 1.1920929e-07;
      auVar53._16_4_ = fVar123;
      fVar124 = local_be0._20_4_ * 1.1920929e-07;
      auVar53._20_4_ = fVar124;
      fVar125 = local_be0._24_4_ * 1.1920929e-07;
      auVar53._24_4_ = fVar125;
      auVar53._28_4_ = 0x34000000;
      auVar112._0_8_ = CONCAT44(fVar120,fVar115) ^ 0x8000000080000000;
      auVar112._8_4_ = -fVar121;
      auVar112._12_4_ = -fVar122;
      auVar112._16_4_ = -fVar123;
      auVar112._20_4_ = -fVar124;
      auVar112._24_4_ = -fVar125;
      auVar112._28_4_ = 0xb4000000;
      auVar74 = vcmpps_avx(auVar74,auVar112,5);
      local_bc0 = ZEXT1632(auVar39);
      auVar81 = vmaxps_avx(local_bc0,local_ac0);
      auVar75 = vmaxps_avx(auVar81,ZEXT1632(auVar78));
      auVar75 = vcmpps_avx(auVar75,auVar53,2);
      auVar75 = vorps_avx(auVar74,auVar75);
      if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar75 >> 0x7f,0) != '\0') ||
            (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar75 >> 0xbf,0) != '\0') ||
          (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar75[0x1f] < '\0') {
        auVar54._4_4_ = fVar110 * auVar93._4_4_;
        auVar54._0_4_ = fVar107 * auVar93._0_4_;
        auVar54._8_4_ = fVar23 * auVar93._8_4_;
        auVar54._12_4_ = fVar26 * auVar93._12_4_;
        auVar54._16_4_ = fVar29 * auVar93._16_4_;
        auVar54._20_4_ = fVar32 * auVar93._20_4_;
        auVar54._24_4_ = fVar35 * auVar93._24_4_;
        auVar54._28_4_ = auVar74._28_4_;
        auVar55._4_4_ = auVar92._4_4_ * fVar109;
        auVar55._0_4_ = auVar92._0_4_ * fVar102;
        auVar55._8_4_ = auVar92._8_4_ * fVar22;
        auVar55._12_4_ = auVar92._12_4_ * fVar25;
        auVar55._16_4_ = auVar92._16_4_ * fVar28;
        auVar55._20_4_ = auVar92._20_4_ * fVar31;
        auVar55._24_4_ = auVar92._24_4_ * fVar34;
        auVar55._28_4_ = 0x34000000;
        auVar39 = vfmsub213ps_fma(auVar92,local_ba0,auVar54);
        auVar56._4_4_ = auVar82._4_4_ * fVar108;
        auVar56._0_4_ = auVar82._0_4_ * fVar106;
        auVar56._8_4_ = auVar82._8_4_ * fVar21;
        auVar56._12_4_ = auVar82._12_4_ * fVar24;
        auVar56._16_4_ = auVar82._16_4_ * fVar27;
        auVar56._20_4_ = auVar82._20_4_ * fVar30;
        auVar56._24_4_ = auVar82._24_4_ * fVar33;
        auVar56._28_4_ = auVar81._28_4_;
        auVar57._4_4_ = auVar88._4_4_ * fVar109;
        auVar57._0_4_ = auVar88._0_4_ * fVar102;
        auVar57._8_4_ = auVar88._8_4_ * fVar22;
        auVar57._12_4_ = auVar88._12_4_ * fVar25;
        auVar57._16_4_ = auVar88._16_4_ * fVar28;
        auVar57._20_4_ = auVar88._20_4_ * fVar31;
        auVar57._24_4_ = auVar88._24_4_ * fVar34;
        auVar57._28_4_ = local_be0._28_4_;
        auVar78 = vfmsub213ps_fma(auVar88,local_b80,auVar56);
        auVar74 = vandps_avx(auVar54,auVar84);
        auVar81 = vandps_avx(auVar56,auVar84);
        auVar74 = vcmpps_avx(auVar74,auVar81,1);
        local_a80 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar39),auVar74);
        auVar58._4_4_ = fVar110 * auVar42._4_4_;
        auVar58._0_4_ = fVar107 * auVar42._0_4_;
        auVar58._8_4_ = fVar23 * auVar42._8_4_;
        auVar58._12_4_ = fVar26 * auVar42._12_4_;
        auVar58._16_4_ = fVar29 * auVar42._16_4_;
        auVar58._20_4_ = fVar32 * auVar42._20_4_;
        auVar58._24_4_ = fVar35 * auVar42._24_4_;
        auVar58._28_4_ = auVar74._28_4_;
        auVar39 = vfmsub213ps_fma(auVar42,local_ba0,auVar57);
        auVar59._4_4_ = auVar76._4_4_ * fVar108;
        auVar59._0_4_ = auVar76._0_4_ * fVar106;
        auVar59._8_4_ = auVar76._8_4_ * fVar21;
        auVar59._12_4_ = auVar76._12_4_ * fVar24;
        auVar59._16_4_ = auVar76._16_4_ * fVar27;
        auVar59._20_4_ = auVar76._20_4_ * fVar30;
        auVar59._24_4_ = auVar76._24_4_ * fVar33;
        auVar59._28_4_ = auVar81._28_4_;
        auVar78 = vfmsub213ps_fma(auVar93,auVar41,auVar59);
        auVar74 = vandps_avx(auVar59,auVar84);
        auVar81 = vandps_avx(auVar57,auVar84);
        auVar74 = vcmpps_avx(auVar74,auVar81,1);
        local_a60 = vblendvps_avx(ZEXT1632(auVar39),ZEXT1632(auVar78),auVar74);
        auVar39 = vfmsub213ps_fma(auVar76,local_b80,auVar55);
        auVar78 = vfmsub213ps_fma(auVar82,auVar41,auVar58);
        auVar74 = vandps_avx(auVar55,auVar84);
        auVar81 = vandps_avx(auVar58,auVar84);
        auVar74 = vcmpps_avx(auVar74,auVar81,1);
        local_a40 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar39),auVar74);
        auVar39 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
        fVar102 = local_a40._0_4_;
        auVar85._0_4_ = fVar102 * local_b60;
        fVar115 = local_a40._4_4_;
        auVar85._4_4_ = fVar115 * local_b60;
        fVar106 = local_a40._8_4_;
        auVar85._8_4_ = fVar106 * local_b60;
        fVar107 = local_a40._12_4_;
        auVar85._12_4_ = fVar107 * local_b60;
        fVar108 = local_a40._16_4_;
        auVar85._16_4_ = fVar108 * local_b60;
        fVar109 = local_a40._20_4_;
        auVar85._20_4_ = fVar109 * local_b60;
        fVar110 = local_a40._24_4_;
        auVar85._24_4_ = fVar110 * local_b60;
        auVar85._28_4_ = 0;
        auVar78 = vfmadd213ps_fma(auVar129,local_a60,auVar85);
        auVar78 = vfmadd213ps_fma(local_b40,local_a80,ZEXT1632(auVar78));
        auVar81 = ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                     CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                              CONCAT44(auVar78._4_4_ + auVar78._4_4_,
                                                       auVar78._0_4_ + auVar78._0_4_))));
        auVar60._4_4_ = fVar115 * fVar15;
        auVar60._0_4_ = fVar102 * fVar14;
        auVar60._8_4_ = fVar106 * fVar16;
        auVar60._12_4_ = fVar107 * fVar17;
        auVar60._16_4_ = fVar108 * fVar18;
        auVar60._20_4_ = fVar109 * fVar19;
        auVar60._24_4_ = fVar110 * fVar20;
        auVar60._28_4_ = auVar75._28_4_;
        auVar78 = vfmadd213ps_fma(auVar114,local_a60,auVar60);
        auVar79 = vfmadd213ps_fma(local_ca0,local_a80,ZEXT1632(auVar78));
        auVar74 = vrcpps_avx(auVar81);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar127._16_4_ = 0x3f800000;
        auVar127._20_4_ = 0x3f800000;
        auVar127._24_4_ = 0x3f800000;
        auVar127._28_4_ = 0x3f800000;
        auVar78 = vfnmadd213ps_fma(auVar74,auVar81,auVar127);
        auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar74,auVar74);
        local_9c0 = ZEXT1632(CONCAT412(auVar78._12_4_ * (auVar79._12_4_ + auVar79._12_4_),
                                       CONCAT48(auVar78._8_4_ * (auVar79._8_4_ + auVar79._8_4_),
                                                CONCAT44(auVar78._4_4_ *
                                                         (auVar79._4_4_ + auVar79._4_4_),
                                                         auVar78._0_4_ *
                                                         (auVar79._0_4_ + auVar79._0_4_)))));
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar114._4_4_ = uVar2;
        auVar114._0_4_ = uVar2;
        auVar114._8_4_ = uVar2;
        auVar114._12_4_ = uVar2;
        auVar114._16_4_ = uVar2;
        auVar114._20_4_ = uVar2;
        auVar114._24_4_ = uVar2;
        auVar114._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        local_c80._4_4_ = uVar2;
        local_c80._0_4_ = uVar2;
        local_c80._8_4_ = uVar2;
        local_c80._12_4_ = uVar2;
        local_c80._16_4_ = uVar2;
        local_c80._20_4_ = uVar2;
        local_c80._24_4_ = uVar2;
        local_c80._28_4_ = uVar2;
        auVar74 = vcmpps_avx(auVar114,local_9c0,2);
        auVar75 = vcmpps_avx(local_9c0,local_c80,2);
        auVar74 = vandps_avx(auVar74,auVar75);
        auVar78 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
        auVar39 = vpand_avx(auVar78,auVar39);
        auVar74 = vpmovsxwd_avx2(auVar39);
        if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0x7f,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0xbf,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar74[0x1f] < '\0') {
          auVar74 = vcmpps_avx(auVar81,_DAT_01f7b000,4);
          auVar78 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          auVar39 = vpand_avx(auVar39,auVar78);
          local_a20 = vpmovsxwd_avx2(auVar39);
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a20 >> 0x7f,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_a20 >> 0xbf,0) != '\0') ||
              (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_a20[0x1f] < '\0') {
            uStack_ad0 = 0;
            uStack_acc = 0;
            uStack_ac8 = 0;
            uStack_ac4 = 0;
            local_940 = local_c00;
            auVar74 = vrcpps_avx(local_aa0);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar101._16_4_ = 0x3f800000;
            auVar101._20_4_ = 0x3f800000;
            auVar101._24_4_ = 0x3f800000;
            auVar101._28_4_ = 0x3f800000;
            auVar78 = vfnmadd213ps_fma(local_aa0,auVar74,auVar101);
            auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar74,auVar74);
            auVar96._8_4_ = 0x219392ef;
            auVar96._0_8_ = 0x219392ef219392ef;
            auVar96._12_4_ = 0x219392ef;
            auVar96._16_4_ = 0x219392ef;
            auVar96._20_4_ = 0x219392ef;
            auVar96._24_4_ = 0x219392ef;
            auVar96._28_4_ = 0x219392ef;
            auVar74 = vcmpps_avx(local_be0,auVar96,5);
            auVar74 = vandps_avx(auVar74,ZEXT1632(auVar78));
            auVar61._4_4_ = fStack_adc * auVar74._4_4_;
            auVar61._0_4_ = local_ae0 * auVar74._0_4_;
            auVar61._8_4_ = fStack_ad8 * auVar74._8_4_;
            auVar61._12_4_ = fStack_ad4 * auVar74._12_4_;
            auVar61._16_4_ = auVar74._16_4_ * 0.0;
            auVar61._20_4_ = auVar74._20_4_ * 0.0;
            auVar61._24_4_ = auVar74._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar75 = vminps_avx(auVar61,auVar101);
            auVar62._4_4_ = auVar73._4_4_ * auVar74._4_4_;
            auVar62._0_4_ = auVar73._0_4_ * auVar74._0_4_;
            auVar62._8_4_ = auVar73._8_4_ * auVar74._8_4_;
            auVar62._12_4_ = auVar73._12_4_ * auVar74._12_4_;
            auVar62._16_4_ = auVar74._16_4_ * 0.0;
            auVar62._20_4_ = auVar74._20_4_ * 0.0;
            auVar62._24_4_ = auVar74._24_4_ * 0.0;
            auVar62._28_4_ = auVar41._28_4_;
            auVar74 = vminps_avx(auVar62,auVar101);
            auVar81 = vsubps_avx(auVar101,auVar75);
            auVar114 = vsubps_avx(auVar101,auVar74);
            local_9e0 = vblendvps_avx(auVar74,auVar81,local_c00);
            local_a00 = vblendvps_avx(auVar75,auVar114,local_c00);
            local_980._4_4_ = (float)local_c20._4_4_ * local_a60._4_4_;
            local_980._0_4_ = (float)local_c20._0_4_ * local_a60._0_4_;
            local_980._8_4_ = fStack_c18 * local_a60._8_4_;
            local_980._12_4_ = fStack_c14 * local_a60._12_4_;
            local_980._16_4_ = fStack_c10 * local_a60._16_4_;
            local_980._20_4_ = fStack_c0c * local_a60._20_4_;
            local_980._24_4_ = fStack_c08 * local_a60._24_4_;
            local_980._28_4_ = local_9e0._28_4_;
            local_9a0[0] = local_a80._0_4_ * (float)local_c20._0_4_;
            local_9a0[1] = local_a80._4_4_ * (float)local_c20._4_4_;
            local_9a0[2] = local_a80._8_4_ * fStack_c18;
            local_9a0[3] = local_a80._12_4_ * fStack_c14;
            fStack_990 = local_a80._16_4_ * fStack_c10;
            fStack_98c = local_a80._20_4_ * fStack_c0c;
            fStack_988 = local_a80._24_4_ * fStack_c08;
            uStack_984 = local_a00._28_4_;
            local_960[0] = (float)local_c20._0_4_ * fVar102;
            local_960[1] = (float)local_c20._4_4_ * fVar115;
            local_960[2] = fStack_c18 * fVar106;
            local_960[3] = fStack_c14 * fVar107;
            fStack_950 = fStack_c10 * fVar108;
            fStack_94c = fStack_c0c * fVar109;
            fStack_948 = fStack_c08 * fVar110;
            uStack_944 = uStack_c04;
            auVar39 = vpacksswb_avx(auVar39,auVar39);
            uVar69 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar39 >> 0x3f,0) << 7);
            fStack_b5c = local_b60;
            fStack_b58 = local_b60;
            fStack_b54 = local_b60;
            fStack_b50 = local_b60;
            fStack_b4c = local_b60;
            fStack_b48 = local_b60;
            fStack_b44 = local_b60;
            do {
              uVar44 = 0;
              for (uVar45 = uVar69; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                uVar44 = uVar44 + 1;
              }
              uVar64 = *(uint *)((long)&local_b00 + uVar44 * 4);
              pGVar12 = (pSVar6->geometries).items[uVar64].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_ca0._0_8_ = uVar44;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_cc0._0_8_ = uVar69;
                  uVar69 = (ulong)(uint)((int)uVar44 * 4);
                  local_8c0 = *(undefined4 *)(local_a00 + uVar69);
                  local_8a0 = *(undefined4 *)(local_9e0 + uVar69);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar69);
                  local_cf0.context = context->user;
                  local_880 = *(undefined4 *)((long)&local_b20 + uVar69);
                  local_920 = *(undefined4 *)((long)local_9a0 + uVar69);
                  uVar2 = *(undefined4 *)(local_980 + uVar69);
                  local_900._4_4_ = uVar2;
                  local_900._0_4_ = uVar2;
                  local_900._8_4_ = uVar2;
                  local_900._12_4_ = uVar2;
                  local_900._16_4_ = uVar2;
                  local_900._20_4_ = uVar2;
                  local_900._24_4_ = uVar2;
                  local_900._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)((long)local_960 + uVar69);
                  local_8e0._4_4_ = uVar2;
                  local_8e0._0_4_ = uVar2;
                  local_8e0._8_4_ = uVar2;
                  local_8e0._12_4_ = uVar2;
                  local_8e0._16_4_ = uVar2;
                  local_8e0._20_4_ = uVar2;
                  local_8e0._24_4_ = uVar2;
                  local_8e0._28_4_ = uVar2;
                  local_860._4_4_ = uVar64;
                  local_860._0_4_ = uVar64;
                  local_860._8_4_ = uVar64;
                  local_860._12_4_ = uVar64;
                  local_860._16_4_ = uVar64;
                  local_860._20_4_ = uVar64;
                  local_860._24_4_ = uVar64;
                  local_860._28_4_ = uVar64;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  uStack_87c = local_880;
                  uStack_878 = local_880;
                  uStack_874 = local_880;
                  uStack_870 = local_880;
                  uStack_86c = local_880;
                  uStack_868 = local_880;
                  uStack_864 = local_880;
                  auVar74 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_cf0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_cf0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c60 = local_c40;
                  local_cf0.valid = (int *)local_c60;
                  local_cf0.geometryUserPtr = pGVar12->userPtr;
                  local_cf0.hit = (RTCHitN *)&local_920;
                  local_cf0.N = 8;
                  local_cf0.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar74 = ZEXT1632(auVar74._0_16_);
                    (*pGVar12->occlusionFilterN)(&local_cf0);
                    auVar74 = vpcmpeqd_avx2(auVar74,auVar74);
                  }
                  auVar81 = vpcmpeqd_avx2(local_c60,_DAT_01f7b000);
                  auVar75 = auVar74 & ~auVar81;
                  if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar75 >> 0x7f,0) == '\0') &&
                        (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar75 >> 0xbf,0) == '\0') &&
                      (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar75[0x1f]) {
                    auVar81 = auVar81 ^ auVar74;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar74 = ZEXT1632(auVar74._0_16_);
                      (*p_Var13)(&local_cf0);
                      auVar74 = vpcmpeqd_avx2(auVar74,auVar74);
                    }
                    auVar75 = vpcmpeqd_avx2(local_c60,_DAT_01f7b000);
                    auVar81 = auVar75 ^ auVar74;
                    auVar90._8_4_ = 0xff800000;
                    auVar90._0_8_ = 0xff800000ff800000;
                    auVar90._12_4_ = 0xff800000;
                    auVar90._16_4_ = 0xff800000;
                    auVar90._20_4_ = 0xff800000;
                    auVar90._24_4_ = 0xff800000;
                    auVar90._28_4_ = 0xff800000;
                    auVar74 = vblendvps_avx(auVar90,*(undefined1 (*) [32])(local_cf0.ray + 0x100),
                                            auVar75);
                    *(undefined1 (*) [32])(local_cf0.ray + 0x100) = auVar74;
                  }
                  if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar81 >> 0x7f,0) == '\0') &&
                        (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar81 >> 0xbf,0) == '\0') &&
                      (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar81[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = local_c80._0_4_;
                    uVar69 = local_cc0._0_8_ ^ 1L << (local_ca0._0_8_ & 0x3f);
                    goto LAB_0160be3b;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_0160c015;
              }
              uVar69 = uVar69 ^ 1L << (uVar44 & 0x3f);
LAB_0160be3b:
            } while (uVar69 != 0);
          }
        }
      }
    }
LAB_0160bfea:
    local_e60 = local_e68;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }